

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocalserver_unix.cpp
# Opt level: O2

void __thiscall
QLocalServerPrivate::waitForNewConnection(QLocalServerPrivate *this,int msec,bool *timedOut)

{
  int iVar1;
  int *piVar2;
  long in_FS_OFFSET;
  QLatin1StringView latin1;
  QArrayDataPointer<char16_t> QStack_58;
  QDeadlineTimer local_40;
  pollfd local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_30 = (pollfd)((ulong)(uint)this->listenSocket | 0x100000000);
  QDeadlineTimer::QDeadlineTimer(&local_40,(long)msec,CoarseTimer);
  iVar1 = qt_safe_poll(&local_30,1,local_40);
  if (iVar1 != -1) {
    if (iVar1 == 0) {
      if (timedOut != (bool *)0x0) {
        *timedOut = true;
      }
      goto LAB_00227dbc;
    }
    if (((ulong)local_30 & 0x20000000000000) == 0) {
      _q_onNewConnection(this);
      goto LAB_00227dbc;
    }
    piVar2 = __errno_location();
    *piVar2 = 9;
  }
  latin1.m_data = "QLocalServer::waitForNewConnection";
  latin1.m_size = 0x22;
  QString::QString((QString *)&QStack_58,latin1);
  setError(this,(QString *)&QStack_58);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_58);
  closeServer(this);
LAB_00227dbc:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QLocalServerPrivate::waitForNewConnection(int msec, bool *timedOut)
{
    pollfd pfd = qt_make_pollfd(listenSocket, POLLIN);
    switch (qt_safe_poll(&pfd, 1, QDeadlineTimer(msec))) {
    case 0:
        if (timedOut)
            *timedOut = true;

        return;
        break;
    default:
        if ((pfd.revents & POLLNVAL) == 0) {
            _q_onNewConnection();
            return;
        }

        errno = EBADF;
        Q_FALLTHROUGH();
    case -1:
        setError("QLocalServer::waitForNewConnection"_L1);
        closeServer();
        break;
    }
}